

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O3

void __thiscall
myvk::CommandBuffer::CmdBindDescriptorSets
          (CommandBuffer *this,
          vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
          *descriptor_sets,uint32_t first_set,Ptr<PipelineLayout> *pipeline_layout,
          VkPipelineBindPoint pipeline_bind_point,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *offsets)

{
  uint32_t *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_4d;
  uint32_t local_4c;
  vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_> handles;
  
  local_4c = first_set;
  std::vector<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>::vector
            (&handles,(long)(descriptor_sets->
                            super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(descriptor_sets->
                            super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4,&local_4d);
  if (handles.super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      handles.super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
  }
  else {
    uVar2 = 1;
    uVar3 = 0;
    do {
      handles.super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] =
           ((descriptor_sets->
            super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar3].
            super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_descriptor_set;
      uVar3 = (ulong)uVar2;
      uVar4 = (long)handles.
                    super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)handles.
                    super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      uVar2 = uVar2 + 1;
    } while (uVar3 < uVar4);
  }
  puVar1 = (offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (*vkCmdBindDescriptorSets)
            (this->m_command_buffer,pipeline_bind_point,
             ((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->m_pipeline_layout,local_4c,(uint32_t)uVar4,
             handles.super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (uint32_t)
             ((ulong)((long)(offsets->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar1) >> 2),puVar1);
  if (handles.super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(handles.
                    super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)handles.
                          super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)handles.
                          super__Vector_base<VkDescriptorSet_T_*,_std::allocator<VkDescriptorSet_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CommandBuffer::CmdBindDescriptorSets(const std::vector<Ptr<DescriptorSet>> &descriptor_sets, uint32_t first_set,
                                          const Ptr<PipelineLayout> &pipeline_layout,
                                          VkPipelineBindPoint pipeline_bind_point,
                                          const std::vector<uint32_t> &offsets) const {
	std::vector<VkDescriptorSet> handles(descriptor_sets.size());
	for (uint32_t i = 0; i < handles.size(); ++i)
		handles[i] = descriptor_sets[i]->GetHandle();

	vkCmdBindDescriptorSets(m_command_buffer, pipeline_bind_point, pipeline_layout->GetHandle(), first_set,
	                        handles.size(), handles.data(), offsets.size(), offsets.data());
}